

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCount.h
# Opt level: O0

word If_CutPinDelayMax(word D1,word D2,int nVars,int AddOn)

{
  int iVar1;
  int iVar2;
  word local_30;
  word D;
  int Max;
  int v;
  int AddOn_local;
  int nVars_local;
  word D2_local;
  word D1_local;
  
  local_30 = 0;
  Max = AddOn;
  v = nVars;
  _AddOn_local = D2;
  D2_local = D1;
  for (D._4_4_ = 0; D._4_4_ < v; D._4_4_ = D._4_4_ + 1) {
    iVar1 = If_CutPinDelayGet(D2_local,D._4_4_);
    iVar2 = If_CutPinDelayGet(_AddOn_local,D._4_4_);
    D._0_4_ = Abc_MaxInt(iVar1,iVar2);
    iVar1 = D._4_4_;
    if ((int)D != 0) {
      iVar2 = Abc_MinInt((int)D + Max,0xf);
      If_CutPinDelaySet(&local_30,iVar1,iVar2);
    }
  }
  return local_30;
}

Assistant:

static inline word If_CutPinDelayMax( word D1, word D2, int nVars, int AddOn )
{
    int v, Max;
    word D = 0;
    for ( v = 0; v < nVars; v++ )
        if ( (Max = Abc_MaxInt(If_CutPinDelayGet(D1, v), If_CutPinDelayGet(D2, v))) )
            If_CutPinDelaySet( &D, v, Abc_MinInt(Max + AddOn, 15) );
    return D;
}